

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_swift_service_client_send_function_implementation
          (t_swift_generator *this,ostream *out,t_service *tservice,t_function *tfunction,
          bool needs_protocol)

{
  t_struct *ptVar1;
  t_struct *tstruct;
  t_field *ptVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer pptVar5;
  t_swift_generator *this_00;
  char *pcVar6;
  string argsname;
  string local_170;
  string funname;
  string local_130;
  string proto;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  t_function send_function;
  
  std::__cxx11::string::string((string *)&funname,(string *)&tfunction->name_);
  this_00 = (t_swift_generator *)g_type_bool;
  std::operator+(&local_f0,"send_",&tfunction->name_);
  t_function::t_function(&send_function,(t_type *)this_00,&local_f0,tfunction->arglist_,false);
  std::__cxx11::string::~string((string *)&local_f0);
  function_args_helper_struct_type_abi_cxx11_(&argsname,this_00,tservice,tfunction);
  ptVar1 = tfunction->arglist_;
  pcVar4 = "on outProtocol";
  if ((this->gen_cocoa_ & 1U) != 0) {
    pcVar4 = "__outProtocol";
  }
  pcVar6 = "";
  if (needs_protocol) {
    pcVar6 = pcVar4;
  }
  std::__cxx11::string::string((string *)&proto,pcVar6,(allocator *)&local_170);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"private func ");
  poVar3 = std::operator<<(poVar3,(string *)&send_function.name_);
  poVar3 = std::operator<<(poVar3,"(");
  tstruct = tfunction->arglist_;
  std::__cxx11::string::string((string *)&local_130,(string *)&proto);
  argument_list(&local_170,this,tstruct,&local_130,true);
  poVar3 = std::operator<<(poVar3,(string *)&local_170);
  std::operator<<(poVar3,") throws");
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  block_open(this,out);
  if (this->gen_cocoa_ == false) {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"try outProtocol.writeMessageBegin(name: \"");
    poVar3 = std::operator<<(poVar3,(string *)&funname);
    poVar3 = std::operator<<(poVar3,"\", ");
    poVar3 = std::operator<<(poVar3,"type: ");
    pcVar4 = ".call";
    if (tfunction->oneway_ != false) {
      pcVar4 = ".oneway";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"sequenceID: 0)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"let args = ");
    poVar3 = std::operator<<(poVar3,(string *)&argsname);
    std::operator<<(poVar3,"(");
    pptVar5 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    while (pptVar5 !=
           (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      ptVar2 = *pptVar5;
      poVar3 = std::operator<<(out,(string *)&ptVar2->name_);
      poVar3 = std::operator<<(poVar3,": ");
      std::operator<<(poVar3,(string *)&ptVar2->name_);
      pptVar5 = pptVar5 + 1;
      if (pptVar5 !=
          (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::operator<<(out,", ");
      }
    }
    poVar3 = std::operator<<(out,")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"try args.write(to: outProtocol)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"try outProtocol.writeMessageEnd()");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"try __outProtocol.writeMessageBeginWithName(\"");
    poVar3 = std::operator<<(poVar3,(string *)&funname);
    poVar3 = std::operator<<(poVar3,"\", ");
    poVar3 = std::operator<<(poVar3,"type: ");
    pcVar4 = ".CALL";
    if (tfunction->oneway_ != false) {
      pcVar4 = ".ONEWAY";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"sequenceID: 0)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"let __args = ");
    poVar3 = std::operator<<(poVar3,(string *)&argsname);
    std::operator<<(poVar3,"(");
    pptVar5 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    while (pptVar5 !=
           (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      ptVar2 = *pptVar5;
      poVar3 = std::operator<<(out,(string *)&ptVar2->name_);
      poVar3 = std::operator<<(poVar3,": ");
      std::operator<<(poVar3,(string *)&ptVar2->name_);
      pptVar5 = pptVar5 + 1;
      if (pptVar5 !=
          (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::operator<<(out,", ");
      }
    }
    poVar3 = std::operator<<(out,")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"try ");
    poVar3 = std::operator<<(poVar3,(string *)&argsname);
    poVar3 = std::operator<<(poVar3,".writeValue(__args, toProtocol: __outProtocol)");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"try __outProtocol.writeMessageEnd()");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&proto);
  std::__cxx11::string::~string((string *)&argsname);
  t_function::~t_function(&send_function);
  std::__cxx11::string::~string((string *)&funname);
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client_send_function_implementation(ostream& out,
                                                                                   t_service *tservice,
                                                                                   t_function* tfunction,
                                                                                   bool needs_protocol) {

  string funname = tfunction->get_name();

  t_function send_function(g_type_bool,
                           "send_" + tfunction->get_name(),
                           tfunction->get_arglist());

  string argsname = function_args_helper_struct_type(tservice, tfunction);
  t_struct* arg_struct = tfunction->get_arglist();

  string proto = needs_protocol ? (gen_cocoa_ ? "__outProtocol" : "on outProtocol") : "";
  // Open function
  indent(out) << "private func " << send_function.get_name() << "("
              << argument_list(tfunction->get_arglist(), proto, true)
              << ") throws";
  block_open(out);
  if (!gen_cocoa_) {
    // Serialize the request
    indent(out) << "try outProtocol.writeMessageBegin(name: \"" << funname << "\", "
                << "type: " << (tfunction->is_oneway() ? ".oneway" : ".call") << ", "
                << "sequenceID: 0)" << endl;

    indent(out) << "let args = " << argsname << "(";

    // write out function parameters

    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end();) {
      t_field *tfield = (*f_iter);
      out << tfield->get_name() << ": " << tfield->get_name();
      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }
    out << ")" << endl;
    indent(out) << "try args.write(to: outProtocol)" << endl;
    indent(out) << "try outProtocol.writeMessageEnd()" << endl;
  } else {
    out << endl;

    // Serialize the request
    indent(out) << "try __outProtocol.writeMessageBeginWithName(\"" << funname << "\", "
                << "type: " << (tfunction->is_oneway() ? ".ONEWAY" : ".CALL") << ", "
                << "sequenceID: 0)" << endl;

    out << endl;

    indent(out) << "let __args = " << argsname << "(";

    // write out function parameters

    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end();) {
      t_field *tfield = (*f_iter);
      out << tfield->get_name() << ": " << tfield->get_name();
      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }
    out << ")" << endl;
    indent(out) << "try " << argsname << ".writeValue(__args, toProtocol: __outProtocol)" << endl << endl;
    indent(out) << "try __outProtocol.writeMessageEnd()" << endl;
  }

  block_close(out);
  out << endl;
}